

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_8cc60b::RateRepresentationPredicate::Rate
          (RateRepresentationPredicate *this,string *r)

{
  bool bVar1;
  string *r_local;
  RateRepresentationPredicate *this_local;
  
  bVar1 = std::operator==(r,"SolidModel");
  if (bVar1) {
    this_local._4_4_ = -3;
  }
  else {
    bVar1 = std::operator==(r,"SweptSolid");
    if (bVar1) {
      this_local._4_4_ = -10;
    }
    else {
      bVar1 = std::operator==(r,"Clipping");
      if (bVar1) {
        this_local._4_4_ = -5;
      }
      else {
        bVar1 = std::operator==(r,"Brep");
        if (bVar1) {
          this_local._4_4_ = -2;
        }
        else {
          bVar1 = std::operator==(r,"BoundingBox");
          if ((!bVar1) && (bVar1 = std::operator==(r,"Curve2D"), !bVar1)) {
            return 0;
          }
          this_local._4_4_ = 100;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Rate(const std::string& r) const {
        if (r == "SolidModel") {
            return -3;
        }

        // give strong preference to extruded geometry.
        if (r == "SweptSolid") {
            return -10;
        }

        if (r == "Clipping") {
            return -5;
        }

        // 'Brep' is difficult to get right due to possible voids in the
        // polygon boundaries, so take it only if we are forced to (i.e.
        // if the only alternative is (non-clipping) boolean operations,
        // which are not supported at all).
        if (r == "Brep") {
            return -2;
        }

        // Curves, bounding boxes - those will most likely not be loaded
        // as we can't make any use out of this data. So consider them
        // last.
        if (r == "BoundingBox" || r == "Curve2D") {
            return 100;
        }
        return 0;
    }